

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

FunctionBody * __thiscall
Js::DeferDeserializeFunctionInfo::Deserialize(DeferDeserializeFunctionInfo *this)

{
  code *pcVar1;
  bool bVar2;
  LocalFunctionId functionId;
  FunctionInfo *this_00;
  DeferDeserializeFunctionInfo *pDVar3;
  undefined4 *puVar4;
  FunctionBody *body_00;
  JavascriptMethod originalEntryPoint;
  FunctionBody *pFVar5;
  FunctionBody *body;
  DeferDeserializeFunctionInfo *this_local;
  
  this_00 = FunctionProxy::GetFunctionInfo(&this->super_FunctionProxy);
  pDVar3 = (DeferDeserializeFunctionInfo *)FunctionInfo::GetFunctionProxy(this_00);
  if (pDVar3 != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x8b0,"(this->GetFunctionInfo()->GetFunctionProxy() == this)",
                                "this->GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  body_00 = ByteCodeSerializer::DeserializeFunction
                      ((this->super_FunctionProxy).m_scriptContext,this);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)body_00);
  FunctionProxy::SetLocalFunctionId(&this->super_FunctionProxy,functionId);
  originalEntryPoint = FunctionProxy::GetOriginalEntryPoint((FunctionProxy *)body_00);
  FunctionProxy::SetOriginalEntryPoint(&this->super_FunctionProxy,originalEntryPoint);
  FunctionProxy::Copy(&this->super_FunctionProxy,(FunctionProxy *)body_00);
  FunctionProxy::UpdateFunctionBodyImpl(&this->super_FunctionProxy,body_00);
  pFVar5 = FunctionProxy::GetFunctionBody((FunctionProxy *)body_00);
  if (pFVar5 != body_00) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x8b8,"(body->GetFunctionBody() == body)",
                                "body->GetFunctionBody() == body");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return body_00;
}

Assistant:

FunctionBody* DeferDeserializeFunctionInfo::Deserialize()
    {
        Assert(this->GetFunctionInfo()->GetFunctionProxy() == this);

        FunctionBody * body = ByteCodeSerializer::DeserializeFunction(this->m_scriptContext, this);
        this->SetLocalFunctionId(body->GetLocalFunctionId());
        this->SetOriginalEntryPoint(body->GetOriginalEntryPoint());
        this->Copy(body);
        this->UpdateFunctionBodyImpl(body);

        Assert(body->GetFunctionBody() == body);
        return body;
    }